

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm_debug.cpp
# Opt level: O3

void lvm_debug_p(void)

{
  ostream *poVar1;
  int i;
  long lVar2;
  int iVar3;
  
  lVar2 = 0;
  iVar3 = 0;
  do {
    iVar3 = iVar3 + 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"R",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"--------->",10);
    printf("%08X\t",(ulong)*register_list[lVar2]);
    if (iVar3 == 3) {
      putchar(10);
      iVar3 = 0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  printf("IP--------->%08X\n",(ulong)registe_ptr->IP);
  printf("SP--------->%08X\t",(ulong)registe_ptr->SP);
  printf("BP--------->%08X\n",(ulong)registe_ptr->BP);
  printf("CS--------->%08X\n",(ulong)registe_ptr->CS);
  printf("DS--------->%08X\n",(ulong)registe_ptr->DS);
  printf("flag[0]--------->%02x\t",(ulong)(uint)(int)registe_ptr->flag[0]);
  printf("flag[1]--------->%02x\t",(ulong)(uint)(int)registe_ptr->flag[1]);
  printf("flag[14]--------->%02x\n",(ulong)(uint)(int)registe_ptr->flag[0xe]);
  return;
}

Assistant:

void lvm_debug_p() {
	int count{ 0 };
	for (int i = 0; i < 8; i++)
	{
		++count;
		std::cout << "R" << i << "--------->";
		printf("%08X	", *register_list[i]);
		if (count == 3) {
			count = 0;
			printf("\n");
		}
	}
	printf("IP--------->%08X\n", registe_ptr->IP);
	printf("SP--------->%08X	", registe_ptr->SP);
	printf("BP--------->%08X\n", registe_ptr->BP);
	printf("CS--------->%08X\n", registe_ptr->CS);
	printf("DS--------->%08X\n", registe_ptr->DS);
	printf("flag[0]--------->%02x	", registe_ptr->flag[0]);
	printf("flag[1]--------->%02x	", registe_ptr->flag[1]);
	printf("flag[14]--------->%02x\n", registe_ptr->flag[14]);
}